

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bsplitstrcb(const_bstring str,const_bstring splitStr,int pos,_func_int_void_ptr_int_int *cb,
               void *parm)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  
  uVar3 = 0xffffffff;
  if ((((-1 < pos) && (str != (const_bstring)0x0)) && (cb != (_func_int_void_ptr_int_int *)0x0)) &&
     ((uVar6 = str->slen, splitStr != (const_bstring)0x0 && pos <= (int)uVar6 &&
      (iVar1 = splitStr->slen, -1 < iVar1)))) {
    if (iVar1 == 1) {
      iVar1 = bsplitcb(str,*splitStr->data,pos,cb,parm);
      return iVar1;
    }
    if (iVar1 == 0) {
      uVar3 = 0;
      if ((uint)pos < uVar6) {
        do {
          iVar1 = (*cb)(parm,pos,1);
          if (iVar1 < 0) {
            return iVar1;
          }
          pos = pos + 1;
          uVar3 = 0;
        } while (pos < str->slen);
      }
    }
    else {
      iVar4 = pos;
      if (pos <= (int)(uVar6 - iVar1)) {
        do {
          iVar2 = bcmp(splitStr->data,str->data + iVar4,(long)iVar1);
          iVar5 = iVar4;
          if (iVar2 == 0) {
            iVar1 = (*cb)(parm,pos,iVar4 - pos);
            if (iVar1 < 0) {
              return iVar1;
            }
            iVar1 = splitStr->slen;
            pos = iVar4 + iVar1;
            uVar6 = str->slen;
            iVar5 = pos;
          }
          iVar4 = iVar5 + 1;
        } while (iVar5 < (int)(uVar6 - iVar1));
      }
      uVar3 = (*cb)(parm,pos,uVar6 - pos);
      uVar3 = uVar3 & (int)uVar3 >> 0x1f;
    }
  }
  return uVar3;
}

Assistant:

int bsplitstrcb (const_bstring str, const_bstring splitStr, int pos,
	int (* cb) (void * parm, int ofs, int len), void * parm) {
int i, p, ret;

	if (cb == NULL || str == NULL || pos < 0 || pos > str->slen
	 || splitStr == NULL || splitStr->slen < 0) return BSTR_ERR;

	if (0 == splitStr->slen) {
		for (i=pos; i < str->slen; i++) {
			if ((ret = cb (parm, i, 1)) < 0) return ret;
		}
		return BSTR_OK;
	}

	if (splitStr->slen == 1)
		return bsplitcb (str, splitStr->data[0], pos, cb, parm);

	for (i=p=pos; i <= str->slen - splitStr->slen; i++) {
		if (0 == bstr__memcmp (splitStr->data, str->data + i,
		                       splitStr->slen)) {
			if ((ret = cb (parm, p, i - p)) < 0) return ret;
			i += splitStr->slen;
			p = i;
		}
	}
	if ((ret = cb (parm, p, str->slen - p)) < 0) return ret;
	return BSTR_OK;
}